

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  bool bVar1;
  pointer pbVar2;
  cmFindLibraryHelper helper;
  allocator local_101;
  undefined1 local_100 [224];
  
  cmFindLibraryHelper::cmFindLibraryHelper
            ((cmFindLibraryHelper *)local_100,
             (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
  for (pbVar2 = (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    cmFindLibraryHelper::AddName((cmFindLibraryHelper *)local_100,pbVar2);
  }
  pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar2 == (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_101);
      goto LAB_0035a912;
    }
    bVar1 = cmFindLibraryHelper::CheckDirectory((cmFindLibraryHelper *)local_100,pbVar2);
    pbVar2 = pbVar2 + 1;
  } while (!bVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_100 + 0x80));
LAB_0035a912:
  cmFindLibraryHelper::~cmFindLibraryHelper((cmFindLibraryHelper *)local_100);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryNamesPerDir()
{
  // Search for all names in each directory.
  cmFindLibraryHelper helper(this->Makefile);
  for(std::vector<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end() ; ++ni)
    {
    helper.AddName(*ni);
    }
  // Search every directory.
  for(std::vector<std::string>::const_iterator
        p = this->SearchPaths.begin(); p != this->SearchPaths.end(); ++p)
    {
    if(helper.CheckDirectory(*p))
      {
      return helper.BestPath;
      }
    }
  // Couldn't find the library.
  return "";
}